

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O3

int anon_unknown.dwarf_22332::RtMidiError_getmessage(lua_State *L)

{
  RtMidiError *pRVar1;
  long *plVar2;
  string msg;
  long *local_38;
  undefined8 local_30;
  long local_28 [2];
  
  lua_getfield(L,0xffffd8f0,"luartmidi.rtmidierror");
  pRVar1 = luaGetUserdata<RtMidiError>(L,1,"RtMidiError");
  plVar2 = (long *)(**(code **)(*(long *)pRVar1 + 0x28))(pRVar1);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,*plVar2,plVar2[1] + *plVar2);
  lua_pushlstring(L,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return 1;
}

Assistant:

int RtMidiError_getmessage(lua_State *L) {
	auto &self = getRtMidiError(L, 1);
	auto msg = self.getMessage();
	lua_pushlstring(L, msg.c_str(), msg.size());
	return 1;
}